

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Sym *sym,BasicBlock *block,Loop *loop,Value *srcVal,bool isNotTypeSpecConv,
          bool allowNonPrimitives,Value **loopHeadValRef)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  StackSym *pSVar4;
  PropertySym *pPVar5;
  StackSym *pSVar6;
  undefined4 *puVar7;
  Value *pVVar8;
  Value *pVVar9;
  BVIndex i;
  SymID i_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  IntConstantBounds local_4c;
  IntConstantBounds loopHeadIntConstantBounds;
  IntConstantBounds srcIntConstantBounds;
  
  if (loopHeadValRef != (Value **)0x0) {
    *loopHeadValRef = (Value *)0x0;
  }
  bVar2 = Loop::CanHoistInvariants(loop);
  if (!bVar2) {
    return false;
  }
  if (sym->m_kind == SymKindProperty) {
    pBVar10 = (loop->landingPad->globOptData).liveVarSyms;
    pPVar5 = Sym::AsPropertySym(sym);
    i = (pPVar5->m_stackSym->super_Sym).m_id;
  }
  else {
    if (sym->m_kind != SymKindStack) {
      return false;
    }
    pSVar4 = Sym::AsStackSym(sym);
    if ((pSVar4->field_0x1a & 1) != 0) {
      pSVar4 = Sym::AsStackSym(sym);
      pSVar4 = StackSym::GetVarEquivSym(pSVar4,this->func);
      pSVar6 = Sym::AsStackSym(sym);
      if (pSVar6->m_type == TyInt32) {
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).liveInt32Syms,(pSVar4->super_Sym).m_id);
        if (BVar3 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3990,"(block->globOptData.liveInt32Syms->Test(varSym->m_id))",
                             "block->globOptData.liveInt32Syms->Test(varSym->m_id)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((loop->landingPad->globOptData).liveInt32Syms,(pSVar4->super_Sym).m_id);
        if (BVar3 == '\0') {
          return false;
        }
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((loop->landingPad->globOptData).liveLossyInt32Syms,
                           (pSVar4->super_Sym).m_id);
        if (BVar3 != '\0') {
          pBVar10 = (block->globOptData).liveLossyInt32Syms;
          i_00 = (pSVar4->super_Sym).m_id;
LAB_0043c6e2:
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar10,i_00);
          if (BVar3 == '\0') {
            return false;
          }
        }
      }
      else {
        pSVar6 = Sym::AsStackSym(sym);
        if (pSVar6->m_type == TyFloat64) {
          pBVar10 = (loop->landingPad->globOptData).liveFloat64Syms;
          i_00 = (pSVar4->super_Sym).m_id;
          goto LAB_0043c6e2;
        }
      }
      pSVar4 = Sym::AsStackSym(sym);
      sym = &StackSym::GetVarEquivSym(pSVar4,this->func)->super_Sym;
      goto LAB_0043c709;
    }
    pBVar10 = (loop->landingPad->globOptData).liveVarSyms;
    i = sym->m_id;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar10,i);
  if (BVar3 == '\0') {
    return false;
  }
LAB_0043c709:
  if (srcVal != (Value *)0x0) {
    pVVar8 = GlobOptBlockData::FindValue(&loop->landingPad->globOptData,sym);
    pVVar9 = pVVar8;
    if (loopHeadValRef != (Value **)0x0) {
      *loopHeadValRef = pVVar8;
      pVVar9 = (Value *)0x0;
    }
    if ((pVVar8 != (Value *)0x0) && (pVVar8->valueNumber == srcVal->valueNumber)) {
      if (!allowNonPrimitives) {
        pVVar8 = pVVar9;
        if (loopHeadValRef != (Value **)0x0) {
          pVVar8 = *loopHeadValRef;
        }
        bVar2 = ValueType::IsPrimitive(&pVVar8->valueInfo->super_ValueType);
        if ((!bVar2) &&
           (bVar2 = GlobOptBlockData::IsTypeSpecialized(&loop->landingPad->globOptData,sym), !bVar2)
           ) {
          return false;
        }
      }
      if ((isNotTypeSpecConv) ||
         (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            (loop->symsDefInLoop,(((StackSym *)sym)->super_Sym).m_id), BVar3 == '\0'
         )) {
        loopHeadIntConstantBounds.lowerBound = 0;
        loopHeadIntConstantBounds.upperBound = 0;
        local_4c.lowerBound = 0;
        local_4c.upperBound = 0;
        bVar2 = ValueInfo::TryGetIntConstantBounds
                          (srcVal->valueInfo,&loopHeadIntConstantBounds,false);
        if (!bVar2) {
          return true;
        }
        if (!isNotTypeSpecConv) {
          if (loopHeadIntConstantBounds.lowerBound != loopHeadIntConstantBounds.upperBound) {
            return true;
          }
        }
        if (loopHeadValRef != (Value **)0x0) {
          pVVar9 = *loopHeadValRef;
        }
        bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar9->valueInfo,&local_4c,false);
        if (!bVar2) {
          return false;
        }
        if (local_4c.lowerBound == loopHeadIntConstantBounds.lowerBound) {
          if (local_4c.upperBound == loopHeadIntConstantBounds.upperBound) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptIsInvariant(Sym *sym, BasicBlock *block, Loop *loop, Value *srcVal, bool isNotTypeSpecConv, bool allowNonPrimitives, Value **loopHeadValRef)
{
    Value *localLoopHeadVal;
    if(!loopHeadValRef)
    {
        loopHeadValRef = &localLoopHeadVal;
    }
    Value *&loopHeadVal = *loopHeadValRef;
    loopHeadVal = nullptr;

    if(!loop->CanHoistInvariants())
    {
        return false;
    }

    if (sym->IsStackSym())
    {
        if (sym->AsStackSym()->IsTypeSpec())
        {
            StackSym *varSym = sym->AsStackSym()->GetVarEquivSym(this->func);
            // Make sure the int32/float64 version of this is available.
            // Note: We could handle this by converting the src, but usually the
            // conversion is hoistable if this is hoistable anyway.
            // In some weird cases it may not be however, so we'll bail out.
            if (sym->AsStackSym()->IsInt32())
            {
                Assert(block->globOptData.liveInt32Syms->Test(varSym->m_id));
                if (!loop->landingPad->globOptData.liveInt32Syms->Test(varSym->m_id) ||
                    (loop->landingPad->globOptData.liveLossyInt32Syms->Test(varSym->m_id) &&
                    !block->globOptData.liveLossyInt32Syms->Test(varSym->m_id)))
                {
                    // Either the int32 sym is not live in the landing pad, or it's lossy in the landing pad and the
                    // instruction's block is using the lossless version. In either case, the instruction cannot be hoisted
                    // without doing a conversion of this operand.
                    return false;
                }
            }
            else if (sym->AsStackSym()->IsFloat64())
            {
                if (!loop->landingPad->globOptData.liveFloat64Syms->Test(varSym->m_id))
                {
                    return false;
                }
            }
            sym = sym->AsStackSym()->GetVarEquivSym(this->func);
        }
        else
        {
            // Make sure the var version of this is available.
            // Note: We could handle this by converting the src, but usually the
            // conversion is hoistable if this is hoistable anyway.
            // In some weird cases it may not be however, so we'll bail out.
            if (!loop->landingPad->globOptData.liveVarSyms->Test(sym->m_id))
            {
                return false;
            }
        }
    }
    else if (sym->IsPropertySym())
    {
        if (!loop->landingPad->globOptData.liveVarSyms->Test(sym->AsPropertySym()->m_stackSym->m_id))
        {
            return false;
        }
    }
    else
    {
        return false;
    }

    // We rely on having a value.
    if (srcVal == NULL)
    {
        return false;
    }

    // A symbol is invariant if its current value is the same as it was upon entering the loop.
    loopHeadVal = loop->landingPad->globOptData.FindValue(sym);
    if (loopHeadVal == NULL || loopHeadVal->GetValueNumber() != srcVal->GetValueNumber())
    {
        return false;
    }

    // Can't hoist non-primitives, unless we have safeguards against valueof/tostring.  Additionally, we need to consider
    // the value annotations on the source *before* the loop: if we hoist this instruction outside the loop, we can't
    // necessarily rely on type annotations added (and enforced) earlier in the loop's body.
    //
    // It might look as though !loopHeadVal->GetValueInfo()->IsPrimitive() implies
    // !loop->landingPad->globOptData.IsTypeSpecialized(sym), but it turns out that this is not always the case.  We
    // encountered a test case in which we had previously hoisted a FromVar (to float 64) instruction, but its bailout code was
    // BailoutPrimitiveButString, rather than BailoutNumberOnly, which would have allowed us to conclude that the dest was
    // definitely a float64.  Instead, it was only *likely* a float64, causing IsPrimitive to return false.
    if (!allowNonPrimitives && !loopHeadVal->GetValueInfo()->IsPrimitive() && !loop->landingPad->globOptData.IsTypeSpecialized(sym))
    {
        return false;
    }

    if(!isNotTypeSpecConv && loop->symsDefInLoop->Test(sym->m_id))
    {
        // Typically, a sym is considered invariant if it has the same value in the current block and in the loop landing pad.
        // The sym may have had a different value earlier in the loop or on the back-edge, but as long as it's reassigned to its
        // value outside the loop, it would be considered invariant in this block. Consider that case:
        //     s1 = s2[invariant]
        //     <loop start>
        //         s1 = s2[invariant]
        //                              // s1 now has the same value as in the landing pad, and is considered invariant
        //         s1 += s3
        //                              // s1 is not invariant here, or on the back-edge
        //         ++s3                 // s3 is not invariant, so the add above cannot be hoisted
        //     <loop end>
        //
        // A problem occurs at the point of (s1 += s3) when:
        //     - At (s1 = s2) inside the loop, s1 was made to be the sym store of that value. This by itself is legal, because
        //       after that transfer, s1 and s2 have the same value.
        //     - (s1 += s3) is type-specialized but s1 is not specialized in the loop header. This happens when s1 is not
        //       specialized entering the loop, and since s1 is not used before it's defined in the loop, it's not specialized
        //       on back-edges.
        //
        // With that, at (s1 += s3), the conversion of s1 to the type-specialized version would be hoisted because s1 is
        // invariant just before that instruction. Since this add is specialized, the specialized version of the sym is modified
        // in the loop without a reassignment at (s1 = s2) inside the loop, and (s1 += s3) would then use an incorrect value of
        // s1 (it would use the value of s1 from the previous loop iteration, instead of using the value of s2).
        //
        // The problem here, is that we cannot hoist the conversion of s1 into its specialized version across the assignment
        // (s1 = s2) inside the loop. So for the purposes of type specialization, don't consider a sym invariant if it has a def
        // inside the loop.
        return false;
    }

    // For values with an int range, require additionally that the range is the same as in the landing pad, as the range may
    // have been changed on this path based on branches, and int specialization and invariant hoisting may rely on the range
    // being the same. For type spec conversions, only require that if the value is an int constant in the current block, that
    // it is also an int constant with the same value in the landing pad. Other range differences don't matter for type spec.
    IntConstantBounds srcIntConstantBounds, loopHeadIntConstantBounds;
    if(srcVal->GetValueInfo()->TryGetIntConstantBounds(&srcIntConstantBounds) &&
        (isNotTypeSpecConv || srcIntConstantBounds.IsConstant()) &&
        (
            !loopHeadVal->GetValueInfo()->TryGetIntConstantBounds(&loopHeadIntConstantBounds) ||
            loopHeadIntConstantBounds.LowerBound() != srcIntConstantBounds.LowerBound() ||
            loopHeadIntConstantBounds.UpperBound() != srcIntConstantBounds.UpperBound()
        ))
    {
        return false;
    }

    // Disabling this assert, because it does not hold true when we force specialize in the loop landing pad
    //Assert((!loopHeadVal->GetValueInfo()->IsPrimitive()) || srcVal->GetValueInfo()->IsLikelyPrimitive());

    return true;
}